

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

void __thiscall
chrono::ChBezierCurve::ChBezierCurve
          (ChBezierCurve *this,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *points,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *inCV,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *outCV)

{
  uint __line;
  long lVar1;
  char *__assertion;
  
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_points,points);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_inCV,inCV);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
            (&this->m_outCV,outCV);
  lVar1 = (long)(points->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(points->
                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(lVar1 / 0x18) < 2) {
    __assertion = "points.size() > 1";
    __line = 0x45;
  }
  else if (lVar1 == (long)(inCV->
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inCV->
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) {
    if (lVar1 == (long)(outCV->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(outCV->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    __assertion = "points.size() == outCV.size()";
    __line = 0x47;
  }
  else {
    __assertion = "points.size() == inCV.size()";
    __line = 0x46;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChBezierCurve.cpp"
                ,__line,
                "chrono::ChBezierCurve::ChBezierCurve(const std::vector<ChVector<>> &, const std::vector<ChVector<>> &, const std::vector<ChVector<>> &)"
               );
}

Assistant:

ChBezierCurve::ChBezierCurve(const std::vector<ChVector<> >& points,
                             const std::vector<ChVector<> >& inCV,
                             const std::vector<ChVector<> >& outCV)
    : m_points(points), m_inCV(inCV), m_outCV(outCV) {
    assert(points.size() > 1);
    assert(points.size() == inCV.size());
    assert(points.size() == outCV.size());
}